

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.c
# Opt level: O0

int main(int argc,char **argv)

{
  long *plVar1;
  undefined8 local_48;
  mpt_path p;
  mpt_config *cfg;
  mpt_metatype *mt;
  char **argv_local;
  int argc_local;
  
  p.first = '\0';
  p.flags = '\0';
  p.sep = '\0';
  p.assign = '\0';
  p._28_4_ = 0;
  local_48 = 0;
  p.base = (char *)0x0;
  p.off = 0;
  p.len = 0x2e0000;
  mtrace();
  mpt_path_set(&local_48,"env",0xffffffff);
  plVar1 = (long *)mpt_config_global(&local_48);
  (**(code **)*plVar1)(plVar1,0x85,&p.first);
  mt = (mpt_metatype *)(argv + 1);
  argv_local._0_4_ = argc;
  while (argv_local._0_4_ = (int)argv_local + -1, (int)argv_local != 0) {
    mpt_config_environ(p._24_8_,mt->_vptr,0x5f,0);
    mt = mt + 1;
  }
  mpt_config_set(p._24_8_,"ls.colors",0,0x2e,0);
  (*(code *)**(undefined8 **)p._24_8_)(p._24_8_,0,table_print,_stdout);
  (**(code **)(*plVar1 + 8))(plVar1);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	MPT_INTERFACE(metatype) *mt;
	MPT_INTERFACE(config) *cfg = 0;
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	mtrace();
	
	mpt_path_set(&p, "env", -1);
	mt = mpt_config_global(&p);
	MPT_metatype_convert(mt, MPT_ENUM(TypeConfigPtr), &cfg);
	
	for (++argv; --argc; ++argv) {
		mpt_config_environ(cfg, *argv, '_', 0);
	}
	mpt_config_set(cfg, "ls.colors", 0, '.', 0);
	
	cfg->_vptr->query(cfg, 0, table_print, stdout);
	
	mt->_vptr->unref(mt);
	return 0;
}